

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred_ssse3_intr.c
# Opt level: O2

void ihevc_weighted_pred_uni_ssse3
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD32 wgt0,
               WORD32 off0,WORD32 shift,WORD32 lvl_shift,WORD32 ht,WORD32 wd)

{
  UWORD8 *pUVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  unkbyte10 Var41;
  unkbyte10 Var42;
  unkbyte10 Var43;
  unkbyte10 Var44;
  int iVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  WORD16 *pWVar50;
  int iVar51;
  long lVar52;
  int iVar53;
  short sVar54;
  undefined4 uVar55;
  short sVar59;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar60;
  int iVar61;
  int iVar62;
  short sVar63;
  undefined1 auVar64 [16];
  int iVar65;
  short sVar69;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  short sVar72;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar73;
  short sVar77;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar78;
  undefined1 auVar81 [16];
  int iVar82;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar87;
  undefined1 auVar90 [16];
  int iVar91;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar66 [12];
  undefined1 auVar74 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [16];
  undefined1 auVar83 [12];
  undefined1 auVar84 [16];
  undefined1 auVar88 [12];
  undefined1 auVar89 [16];
  undefined1 auVar92 [12];
  undefined1 auVar93 [16];
  
  if ((wd & 3U) != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_ssse3_intr.c"
                  ,0x84,
                  "void ihevc_weighted_pred_uni_ssse3(WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if ((ht & 3U) == 0) {
    iVar51 = 1 << ((char)shift - 1U & 0x1f);
    auVar56 = pshuflw(ZEXT416((uint)lvl_shift),ZEXT416((uint)lvl_shift),0);
    uVar55 = auVar56._0_4_;
    auVar68._4_4_ = uVar55;
    auVar68._0_4_ = uVar55;
    auVar68._8_4_ = uVar55;
    auVar68._12_4_ = uVar55;
    auVar57 = pshuflw(ZEXT416((uint)wgt0),ZEXT416((uint)wgt0),0);
    auVar58._0_4_ = auVar57._0_4_;
    auVar58._4_4_ = auVar58._0_4_;
    auVar58._8_4_ = auVar58._0_4_;
    auVar58._12_4_ = auVar58._0_4_;
    sVar54 = auVar57._0_2_;
    sVar59 = auVar57._2_2_;
    sVar63 = auVar56._2_2_ * sVar59;
    auVar57 = pmulhw(auVar68,auVar58);
    iVar53 = CONCAT22(auVar57._6_2_,sVar63);
    Var41 = CONCAT64(CONCAT42(iVar53,auVar57._4_2_),CONCAT22(auVar56._0_2_ * sVar54,sVar63));
    auVar34._4_8_ = (long)((unkuint10)Var41 >> 0x10);
    auVar34._2_2_ = auVar57._2_2_;
    auVar34._0_2_ = auVar56._2_2_ * sVar59;
    iVar60 = iVar51 + CONCAT22(auVar57._0_2_,auVar56._0_2_ * sVar54);
    iVar61 = iVar51 + auVar34._0_4_;
    iVar62 = iVar51 + (int)((unkuint10)Var41 >> 0x10);
    iVar51 = iVar51 + iVar53;
    lVar48 = (long)wd;
    lVar52 = dst_strd * 4 - lVar48;
    if ((wd & 4U) == 0) {
      auVar56 = ZEXT416((uint)shift);
      for (iVar53 = 0; iVar53 < ht; iVar53 = iVar53 + 4) {
        pWVar50 = pi2_src + (src_strd * 4 - lVar48);
        for (lVar49 = 0; (int)lVar49 < wd; lVar49 = lVar49 + 8) {
          auVar57 = *(undefined1 (*) [16])(pi2_src + lVar49);
          auVar68 = *(undefined1 (*) [16])(pi2_src + src_strd + lVar49);
          auVar71 = *(undefined1 (*) [16])(pi2_src + src_strd * 2 + lVar49);
          auVar76 = *(undefined1 (*) [16])(pi2_src + src_strd * 3 + lVar49);
          sVar63 = auVar57._6_2_ * sVar59;
          sVar69 = auVar68._6_2_ * sVar59;
          sVar72 = auVar71._6_2_ * sVar59;
          sVar77 = auVar76._6_2_ * sVar59;
          auVar95 = pmulhw(auVar57,auVar58);
          auVar96 = pmulhw(auVar68,auVar58);
          auVar97 = pmulhw(auVar71,auVar58);
          auVar98 = pmulhw(auVar76,auVar58);
          iVar91 = CONCAT22(auVar95._8_2_,auVar57._8_2_ * sVar54);
          auVar92._0_8_ = CONCAT26(auVar95._10_2_,CONCAT24(auVar57._10_2_ * sVar59,iVar91));
          auVar92._8_2_ = auVar57._12_2_ * sVar54;
          auVar92._10_2_ = auVar95._12_2_;
          auVar93._12_2_ = auVar57._14_2_ * sVar59;
          auVar93._0_12_ = auVar92;
          auVar93._14_2_ = auVar95._14_2_;
          iVar87 = CONCAT22(auVar96._8_2_,auVar68._8_2_ * sVar54);
          auVar88._0_8_ = CONCAT26(auVar96._10_2_,CONCAT24(auVar68._10_2_ * sVar59,iVar87));
          auVar88._8_2_ = auVar68._12_2_ * sVar54;
          auVar88._10_2_ = auVar96._12_2_;
          auVar89._12_2_ = auVar68._14_2_ * sVar59;
          auVar89._0_12_ = auVar88;
          auVar89._14_2_ = auVar96._14_2_;
          iVar82 = CONCAT22(auVar97._8_2_,auVar71._8_2_ * sVar54);
          auVar83._0_8_ = CONCAT26(auVar97._10_2_,CONCAT24(auVar71._10_2_ * sVar59,iVar82));
          auVar83._8_2_ = auVar71._12_2_ * sVar54;
          auVar83._10_2_ = auVar97._12_2_;
          auVar84._12_2_ = auVar71._14_2_ * sVar59;
          auVar84._0_12_ = auVar83;
          auVar84._14_2_ = auVar97._14_2_;
          iVar78 = CONCAT22(auVar98._8_2_,auVar76._8_2_ * sVar54);
          auVar79._0_8_ = CONCAT26(auVar98._10_2_,CONCAT24(auVar76._10_2_ * sVar59,iVar78));
          auVar79._8_2_ = auVar76._12_2_ * sVar54;
          auVar79._10_2_ = auVar98._12_2_;
          auVar80._12_2_ = auVar76._14_2_ * sVar59;
          auVar80._0_12_ = auVar79;
          auVar80._14_2_ = auVar98._14_2_;
          iVar45 = CONCAT22(auVar95._6_2_,sVar63);
          Var41 = CONCAT64(CONCAT42(iVar45,auVar95._4_2_),CONCAT22(auVar57._4_2_ * sVar54,sVar63));
          auVar35._4_8_ = (long)((unkuint10)Var41 >> 0x10);
          auVar35._2_2_ = auVar95._2_2_;
          auVar35._0_2_ = auVar57._2_2_ * sVar59;
          iVar46 = CONCAT22(auVar96._6_2_,sVar69);
          Var42 = CONCAT64(CONCAT42(iVar46,auVar96._4_2_),CONCAT22(auVar68._4_2_ * sVar54,sVar69));
          auVar36._4_8_ = (long)((unkuint10)Var42 >> 0x10);
          auVar36._2_2_ = auVar96._2_2_;
          auVar36._0_2_ = auVar68._2_2_ * sVar59;
          iVar65 = CONCAT22(auVar97._6_2_,sVar72);
          Var43 = CONCAT64(CONCAT42(iVar65,auVar97._4_2_),CONCAT22(auVar71._4_2_ * sVar54,sVar72));
          auVar37._4_8_ = (long)((unkuint10)Var43 >> 0x10);
          auVar37._2_2_ = auVar97._2_2_;
          auVar37._0_2_ = auVar71._2_2_ * sVar59;
          iVar73 = CONCAT22(auVar98._6_2_,sVar77);
          Var44 = CONCAT64(CONCAT42(iVar73,auVar98._4_2_),CONCAT22(auVar76._4_2_ * sVar54,sVar77));
          auVar38._4_8_ = (long)((unkuint10)Var44 >> 0x10);
          auVar38._2_2_ = auVar98._2_2_;
          auVar38._0_2_ = auVar76._2_2_ * sVar59;
          auVar64._0_4_ =
               (CONCAT22(auVar95._0_2_,auVar57._0_2_ * sVar54) + iVar60 >> auVar56) + off0;
          auVar64._4_4_ = (auVar35._0_4_ + iVar61 >> auVar56) + off0;
          auVar64._8_4_ = ((int)((unkuint10)Var41 >> 0x10) + iVar62 >> auVar56) + off0;
          auVar64._12_4_ = (iVar45 + iVar51 >> auVar56) + off0;
          auVar67._0_4_ =
               (CONCAT22(auVar96._0_2_,auVar68._0_2_ * sVar54) + iVar60 >> auVar56) + off0;
          auVar67._4_4_ = (auVar36._0_4_ + iVar61 >> auVar56) + off0;
          auVar67._8_4_ = ((int)((unkuint10)Var42 >> 0x10) + iVar62 >> auVar56) + off0;
          auVar67._12_4_ = (iVar46 + iVar51 >> auVar56) + off0;
          auVar70._0_4_ =
               (CONCAT22(auVar97._0_2_,auVar71._0_2_ * sVar54) + iVar60 >> auVar56) + off0;
          auVar70._4_4_ = (auVar37._0_4_ + iVar61 >> auVar56) + off0;
          auVar70._8_4_ = ((int)((unkuint10)Var43 >> 0x10) + iVar62 >> auVar56) + off0;
          auVar70._12_4_ = (iVar65 + iVar51 >> auVar56) + off0;
          auVar75._0_4_ =
               (CONCAT22(auVar98._0_2_,auVar76._0_2_ * sVar54) + iVar60 >> auVar56) + off0;
          auVar75._4_4_ = (auVar38._0_4_ + iVar61 >> auVar56) + off0;
          auVar75._8_4_ = ((int)((unkuint10)Var44 >> 0x10) + iVar62 >> auVar56) + off0;
          auVar75._12_4_ = (iVar73 + iVar51 >> auVar56) + off0;
          auVar94._0_4_ = (iVar91 + iVar60 >> auVar56) + off0;
          auVar94._4_4_ = ((int)((ulong)auVar92._0_8_ >> 0x20) + iVar61 >> auVar56) + off0;
          auVar94._8_4_ = (auVar92._8_4_ + iVar62 >> auVar56) + off0;
          auVar94._12_4_ = (auVar93._12_4_ + iVar51 >> auVar56) + off0;
          auVar57 = packssdw(auVar64,auVar94);
          sVar63 = auVar57._0_2_;
          sVar6 = auVar57._2_2_;
          sVar10 = auVar57._4_2_;
          sVar14 = auVar57._6_2_;
          sVar18 = auVar57._8_2_;
          sVar22 = auVar57._10_2_;
          sVar26 = auVar57._12_2_;
          sVar30 = auVar57._14_2_;
          auVar90._0_4_ = (iVar87 + iVar60 >> auVar56) + off0;
          auVar90._4_4_ = ((int)((ulong)auVar88._0_8_ >> 0x20) + iVar61 >> auVar56) + off0;
          auVar90._8_4_ = (auVar88._8_4_ + iVar62 >> auVar56) + off0;
          auVar90._12_4_ = (auVar89._12_4_ + iVar51 >> auVar56) + off0;
          auVar68 = packssdw(auVar67,auVar90);
          sVar69 = auVar68._0_2_;
          sVar7 = auVar68._2_2_;
          sVar11 = auVar68._4_2_;
          sVar15 = auVar68._6_2_;
          sVar19 = auVar68._8_2_;
          sVar23 = auVar68._10_2_;
          sVar27 = auVar68._12_2_;
          sVar31 = auVar68._14_2_;
          auVar85._0_4_ = (iVar82 + iVar60 >> auVar56) + off0;
          auVar85._4_4_ = ((int)((ulong)auVar83._0_8_ >> 0x20) + iVar61 >> auVar56) + off0;
          auVar85._8_4_ = (auVar83._8_4_ + iVar62 >> auVar56) + off0;
          auVar85._12_4_ = (auVar84._12_4_ + iVar51 >> auVar56) + off0;
          auVar71 = packssdw(auVar70,auVar85);
          sVar72 = auVar71._0_2_;
          sVar8 = auVar71._2_2_;
          sVar12 = auVar71._4_2_;
          sVar16 = auVar71._6_2_;
          sVar20 = auVar71._8_2_;
          sVar24 = auVar71._10_2_;
          sVar28 = auVar71._12_2_;
          sVar32 = auVar71._14_2_;
          auVar81._0_4_ = (iVar78 + iVar60 >> auVar56) + off0;
          auVar81._4_4_ = ((int)((ulong)auVar79._0_8_ >> 0x20) + iVar61 >> auVar56) + off0;
          auVar81._8_4_ = (auVar79._8_4_ + iVar62 >> auVar56) + off0;
          auVar81._12_4_ = (auVar80._12_4_ + iVar51 >> auVar56) + off0;
          auVar76 = packssdw(auVar75,auVar81);
          sVar77 = auVar76._0_2_;
          sVar9 = auVar76._2_2_;
          sVar13 = auVar76._4_2_;
          sVar17 = auVar76._6_2_;
          sVar21 = auVar76._8_2_;
          sVar25 = auVar76._10_2_;
          sVar29 = auVar76._12_2_;
          sVar33 = auVar76._14_2_;
          *(ulong *)(pu1_dst + lVar49) =
               CONCAT17((0 < sVar30) * (sVar30 < 0x100) * auVar57[0xe] - (0xff < sVar30),
                        CONCAT16((0 < sVar26) * (sVar26 < 0x100) * auVar57[0xc] - (0xff < sVar26),
                                 CONCAT15((0 < sVar22) * (sVar22 < 0x100) * auVar57[10] -
                                          (0xff < sVar22),
                                          CONCAT14((0 < sVar18) * (sVar18 < 0x100) * auVar57[8] -
                                                   (0xff < sVar18),
                                                   CONCAT13((0 < sVar14) * (sVar14 < 0x100) *
                                                            auVar57[6] - (0xff < sVar14),
                                                            CONCAT12((0 < sVar10) * (sVar10 < 0x100)
                                                                     * auVar57[4] - (0xff < sVar10),
                                                                     CONCAT11((0 < sVar6) *
                                                                              (sVar6 < 0x100) *
                                                                              auVar57[2] -
                                                                              (0xff < sVar6),
                                                                              (0 < sVar63) *
                                                                              (sVar63 < 0x100) *
                                                                              auVar57[0] -
                                                                              (0xff < sVar63))))))))
          ;
          *(ulong *)(pu1_dst + lVar49 + dst_strd) =
               CONCAT17((0 < sVar31) * (sVar31 < 0x100) * auVar68[0xe] - (0xff < sVar31),
                        CONCAT16((0 < sVar27) * (sVar27 < 0x100) * auVar68[0xc] - (0xff < sVar27),
                                 CONCAT15((0 < sVar23) * (sVar23 < 0x100) * auVar68[10] -
                                          (0xff < sVar23),
                                          CONCAT14((0 < sVar19) * (sVar19 < 0x100) * auVar68[8] -
                                                   (0xff < sVar19),
                                                   CONCAT13((0 < sVar15) * (sVar15 < 0x100) *
                                                            auVar68[6] - (0xff < sVar15),
                                                            CONCAT12((0 < sVar11) * (sVar11 < 0x100)
                                                                     * auVar68[4] - (0xff < sVar11),
                                                                     CONCAT11((0 < sVar7) *
                                                                              (sVar7 < 0x100) *
                                                                              auVar68[2] -
                                                                              (0xff < sVar7),
                                                                              (0 < sVar69) *
                                                                              (sVar69 < 0x100) *
                                                                              auVar68[0] -
                                                                              (0xff < sVar69))))))))
          ;
          *(ulong *)(pu1_dst + lVar49 + dst_strd * 2) =
               CONCAT17((0 < sVar32) * (sVar32 < 0x100) * auVar71[0xe] - (0xff < sVar32),
                        CONCAT16((0 < sVar28) * (sVar28 < 0x100) * auVar71[0xc] - (0xff < sVar28),
                                 CONCAT15((0 < sVar24) * (sVar24 < 0x100) * auVar71[10] -
                                          (0xff < sVar24),
                                          CONCAT14((0 < sVar20) * (sVar20 < 0x100) * auVar71[8] -
                                                   (0xff < sVar20),
                                                   CONCAT13((0 < sVar16) * (sVar16 < 0x100) *
                                                            auVar71[6] - (0xff < sVar16),
                                                            CONCAT12((0 < sVar12) * (sVar12 < 0x100)
                                                                     * auVar71[4] - (0xff < sVar12),
                                                                     CONCAT11((0 < sVar8) *
                                                                              (sVar8 < 0x100) *
                                                                              auVar71[2] -
                                                                              (0xff < sVar8),
                                                                              (0 < sVar72) *
                                                                              (sVar72 < 0x100) *
                                                                              auVar71[0] -
                                                                              (0xff < sVar72))))))))
          ;
          *(ulong *)(pu1_dst + lVar49 + dst_strd * 3) =
               CONCAT17((0 < sVar33) * (sVar33 < 0x100) * auVar76[0xe] - (0xff < sVar33),
                        CONCAT16((0 < sVar29) * (sVar29 < 0x100) * auVar76[0xc] - (0xff < sVar29),
                                 CONCAT15((0 < sVar25) * (sVar25 < 0x100) * auVar76[10] -
                                          (0xff < sVar25),
                                          CONCAT14((0 < sVar21) * (sVar21 < 0x100) * auVar76[8] -
                                                   (0xff < sVar21),
                                                   CONCAT13((0 < sVar17) * (sVar17 < 0x100) *
                                                            auVar76[6] - (0xff < sVar17),
                                                            CONCAT12((0 < sVar13) * (sVar13 < 0x100)
                                                                     * auVar76[4] - (0xff < sVar13),
                                                                     CONCAT11((0 < sVar9) *
                                                                              (sVar9 < 0x100) *
                                                                              auVar76[2] -
                                                                              (0xff < sVar9),
                                                                              (0 < sVar77) *
                                                                              (sVar77 < 0x100) *
                                                                              auVar76[0] -
                                                                              (0xff < sVar77))))))))
          ;
          pWVar50 = pWVar50 + 8;
        }
        pu1_dst = pu1_dst + lVar49 + lVar52;
        pi2_src = pWVar50;
      }
    }
    else {
      auVar56 = ZEXT416((uint)shift);
      for (iVar53 = 0; iVar53 < ht; iVar53 = iVar53 + 4) {
        pWVar50 = pi2_src + (src_strd * 4 - lVar48);
        for (lVar49 = 0; (int)lVar49 < wd; lVar49 = lVar49 + 4) {
          uVar2 = *(undefined8 *)(pi2_src + src_strd * 2 + lVar49);
          uVar3 = *(undefined8 *)(pi2_src + lVar49);
          auVar98._8_8_ = uVar2;
          auVar98._0_8_ = uVar3;
          uVar4 = *(undefined8 *)(pi2_src + src_strd * 3 + lVar49);
          uVar5 = *(undefined8 *)(pi2_src + src_strd + lVar49);
          auVar86._8_8_ = uVar4;
          auVar86._0_8_ = uVar5;
          sVar63 = sVar59 * (short)((ulong)uVar3 >> 0x30);
          sVar69 = sVar59 * (short)((ulong)uVar5 >> 0x30);
          auVar57 = pmulhw(auVar98,auVar58);
          auVar68 = pmulhw(auVar86,auVar58);
          iVar65 = CONCAT22(auVar57._8_2_,sVar54 * (short)uVar2);
          auVar66._0_8_ =
               CONCAT26(auVar57._10_2_,CONCAT24(sVar59 * (short)((ulong)uVar2 >> 0x10),iVar65));
          auVar66._8_2_ = sVar54 * (short)((ulong)uVar2 >> 0x20);
          auVar66._10_2_ = auVar57._12_2_;
          auVar71._12_2_ = sVar59 * (short)((ulong)uVar2 >> 0x30);
          auVar71._0_12_ = auVar66;
          auVar71._14_2_ = auVar57._14_2_;
          iVar73 = CONCAT22(auVar68._8_2_,sVar54 * (short)uVar4);
          auVar74._0_8_ =
               CONCAT26(auVar68._10_2_,CONCAT24(sVar59 * (short)((ulong)uVar4 >> 0x10),iVar73));
          auVar74._8_2_ = sVar54 * (short)((ulong)uVar4 >> 0x20);
          auVar74._10_2_ = auVar68._12_2_;
          auVar96._12_2_ = sVar59 * (short)((ulong)uVar4 >> 0x30);
          auVar96._0_12_ = auVar74;
          auVar96._14_2_ = auVar68._14_2_;
          iVar45 = CONCAT22(auVar57._6_2_,sVar63);
          Var41 = CONCAT64(CONCAT42(iVar45,auVar57._4_2_),
                           CONCAT22(sVar54 * (short)((ulong)uVar3 >> 0x20),sVar63));
          auVar39._4_8_ = (long)((unkuint10)Var41 >> 0x10);
          auVar39._2_2_ = auVar57._2_2_;
          auVar39._0_2_ = sVar59 * (short)((ulong)uVar3 >> 0x10);
          iVar46 = CONCAT22(auVar68._6_2_,sVar69);
          Var42 = CONCAT64(CONCAT42(iVar46,auVar68._4_2_),
                           CONCAT22(sVar54 * (short)((ulong)uVar5 >> 0x20),sVar69));
          auVar40._4_8_ = (long)((unkuint10)Var42 >> 0x10);
          auVar40._2_2_ = auVar68._2_2_;
          auVar40._0_2_ = sVar59 * (short)((ulong)uVar5 >> 0x10);
          auVar57._0_4_ = (CONCAT22(auVar57._0_2_,sVar54 * (short)uVar3) + iVar60 >> auVar56) + off0
          ;
          auVar57._4_4_ = (auVar39._0_4_ + iVar61 >> auVar56) + off0;
          auVar57._8_4_ = ((int)((unkuint10)Var41 >> 0x10) + iVar62 >> auVar56) + off0;
          auVar57._12_4_ = (iVar45 + iVar51 >> auVar56) + off0;
          auVar95._0_4_ = (CONCAT22(auVar68._0_2_,sVar54 * (short)uVar5) + iVar60 >> auVar56) + off0
          ;
          auVar95._4_4_ = (auVar40._0_4_ + iVar61 >> auVar56) + off0;
          auVar95._8_4_ = ((int)((unkuint10)Var42 >> 0x10) + iVar62 >> auVar56) + off0;
          auVar95._12_4_ = (iVar46 + iVar51 >> auVar56) + off0;
          auVar57 = packssdw(auVar57,auVar95);
          auVar76._0_4_ = (iVar65 + iVar60 >> auVar56) + off0;
          auVar76._4_4_ = ((int)((ulong)auVar66._0_8_ >> 0x20) + iVar61 >> auVar56) + off0;
          auVar76._8_4_ = (auVar66._8_4_ + iVar62 >> auVar56) + off0;
          auVar76._12_4_ = (auVar71._12_4_ + iVar51 >> auVar56) + off0;
          auVar97._0_4_ = (iVar73 + iVar60 >> auVar56) + off0;
          auVar97._4_4_ = ((int)((ulong)auVar74._0_8_ >> 0x20) + iVar61 >> auVar56) + off0;
          auVar97._8_4_ = (auVar74._8_4_ + iVar62 >> auVar56) + off0;
          auVar97._12_4_ = (auVar96._12_4_ + iVar51 >> auVar56) + off0;
          auVar68 = packssdw(auVar76,auVar97);
          sVar63 = auVar57._0_2_;
          sVar69 = auVar57._2_2_;
          sVar72 = auVar57._4_2_;
          sVar77 = auVar57._6_2_;
          sVar6 = auVar57._8_2_;
          sVar7 = auVar57._10_2_;
          sVar8 = auVar57._12_2_;
          sVar9 = auVar57._14_2_;
          sVar10 = auVar68._0_2_;
          sVar11 = auVar68._2_2_;
          sVar12 = auVar68._4_2_;
          sVar13 = auVar68._6_2_;
          sVar14 = auVar68._8_2_;
          sVar15 = auVar68._10_2_;
          sVar16 = auVar68._12_2_;
          sVar17 = auVar68._14_2_;
          pUVar1 = pu1_dst + lVar49;
          *pUVar1 = (0 < sVar63) * (sVar63 < 0x100) * auVar57[0] - (0xff < sVar63);
          pUVar1[1] = (0 < sVar69) * (sVar69 < 0x100) * auVar57[2] - (0xff < sVar69);
          pUVar1[2] = (0 < sVar72) * (sVar72 < 0x100) * auVar57[4] - (0xff < sVar72);
          pUVar1[3] = (0 < sVar77) * (sVar77 < 0x100) * auVar57[6] - (0xff < sVar77);
          lVar47 = lVar49 + dst_strd;
          pu1_dst[lVar47 + 4] = (0 < sVar6) * (sVar6 < 0x100) * auVar57[8] - (0xff < sVar6);
          pu1_dst[lVar47 + 5] = (0 < sVar7) * (sVar7 < 0x100) * auVar57[10] - (0xff < sVar7);
          pu1_dst[lVar47 + 6] = (0 < sVar8) * (sVar8 < 0x100) * auVar57[0xc] - (0xff < sVar8);
          pu1_dst[lVar47 + 7] = (0 < sVar9) * (sVar9 < 0x100) * auVar57[0xe] - (0xff < sVar9);
          lVar47 = lVar49 + dst_strd * 2;
          pu1_dst[lVar47 + 8] = (0 < sVar10) * (sVar10 < 0x100) * auVar68[0] - (0xff < sVar10);
          pu1_dst[lVar47 + 9] = (0 < sVar11) * (sVar11 < 0x100) * auVar68[2] - (0xff < sVar11);
          pu1_dst[lVar47 + 10] = (0 < sVar12) * (sVar12 < 0x100) * auVar68[4] - (0xff < sVar12);
          pu1_dst[lVar47 + 0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar68[6] - (0xff < sVar13);
          lVar47 = lVar49 + dst_strd * 3;
          pu1_dst[lVar47 + 0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar68[8] - (0xff < sVar14);
          pu1_dst[lVar47 + 0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar68[10] - (0xff < sVar15);
          pu1_dst[lVar47 + 0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar68[0xc] - (0xff < sVar16);
          pu1_dst[lVar47 + 0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar68[0xe] - (0xff < sVar17);
          pWVar50 = pWVar50 + 4;
        }
        pu1_dst = pu1_dst + lVar49 + lVar52;
        pi2_src = pWVar50;
      }
    }
    return;
  }
  __assert_fail("(ht % 4 == 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_ssse3_intr.c"
                ,0x85,
                "void ihevc_weighted_pred_uni_ssse3(WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
               );
}

Assistant:

void ihevc_weighted_pred_uni_ssse3(WORD16 *pi2_src,
                                   UWORD8 *pu1_dst,
                                   WORD32 src_strd,
                                   WORD32 dst_strd,
                                   WORD32 wgt0,
                                   WORD32 off0,
                                   WORD32 shift,
                                   WORD32 lvl_shift,
                                   WORD32 ht,
                                   WORD32 wd)
{
    WORD32 row, col, temp;

    /* all 128 bit registers are named with a suffix mxnb, where m is the */
    /* number of n bits packed in the register                            */
    __m128i src_temp0_8x16b, src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b;
    __m128i const_temp_4x32b, lvl_shift_4x32b, wgt0_8x16b, off0_4x32b;
    __m128i res_temp0_4x32b, res_temp1_4x32b, res_temp2_4x32b, res_temp3_4x32b;

    ASSERT(wd % 4 == 0); /* checking assumption*/
    ASSERT(ht % 4 == 0); /* checking assumption*/

    temp = 1 << (shift - 1);

    // seting values in register
    lvl_shift_4x32b = _mm_set1_epi16(lvl_shift);
    wgt0_8x16b = _mm_set1_epi16(wgt0);

    /* lvl_shift * wgt0 */
    res_temp0_4x32b = _mm_mullo_epi16(lvl_shift_4x32b, wgt0_8x16b);
    res_temp1_4x32b = _mm_mulhi_epi16(lvl_shift_4x32b, wgt0_8x16b);

    const_temp_4x32b = _mm_set1_epi32(temp);
    off0_4x32b = _mm_set1_epi32(off0);


    /* lvl_shift * wgt0 */
    lvl_shift_4x32b = _mm_unpacklo_epi16(res_temp0_4x32b, res_temp1_4x32b);
    /* lvl_shift * wgt0 + 1 << (shift - 1) */
    lvl_shift_4x32b = _mm_add_epi32(lvl_shift_4x32b, const_temp_4x32b);

    if(0 == (wd & 7)) /* wd multiple of 8 case */
    {
        __m128i res_temp4_4x32b, res_temp5_4x32b, res_temp6_4x32b, res_temp7_4x32b;

        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 8)
            {   /* for row =0 ,1,2,3*/

                /* row = 0 */ /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp0_8x16b = _mm_loadu_si128((__m128i *)(pi2_src));
                /* row = 1 */
                src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pi2_src + src_strd));
                /* row = 2 */
                src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pi2_src + 2 * src_strd));
                /* row = 3 */
                src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pi2_src + 3 * src_strd));

                /*i4_tmp = (pi2_src[col]) * wgt0*/ /* Lower 16 bit */
                res_temp0_4x32b  = _mm_mullo_epi16(src_temp0_8x16b, wgt0_8x16b);
                res_temp1_4x32b  = _mm_mullo_epi16(src_temp1_8x16b, wgt0_8x16b);
                res_temp2_4x32b  = _mm_mullo_epi16(src_temp2_8x16b, wgt0_8x16b);
                res_temp3_4x32b  = _mm_mullo_epi16(src_temp3_8x16b, wgt0_8x16b);

                /*i4_tmp = (pi2_src[col] ) * wgt0*/ /* Higher 16 bit */
                src_temp0_8x16b  = _mm_mulhi_epi16(src_temp0_8x16b, wgt0_8x16b);
                src_temp1_8x16b  = _mm_mulhi_epi16(src_temp1_8x16b, wgt0_8x16b);
                src_temp2_8x16b  = _mm_mulhi_epi16(src_temp2_8x16b, wgt0_8x16b);
                src_temp3_8x16b  = _mm_mulhi_epi16(src_temp3_8x16b, wgt0_8x16b);

                /* Get 32 bit Result */
                res_temp4_4x32b = _mm_unpackhi_epi16(res_temp0_4x32b, src_temp0_8x16b);
                res_temp5_4x32b = _mm_unpackhi_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp6_4x32b = _mm_unpackhi_epi16(res_temp2_4x32b, src_temp2_8x16b);
                res_temp7_4x32b = _mm_unpackhi_epi16(res_temp3_4x32b, src_temp3_8x16b);

                res_temp0_4x32b = _mm_unpacklo_epi16(res_temp0_4x32b, src_temp0_8x16b);
                res_temp1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp2_4x32b = _mm_unpacklo_epi16(res_temp2_4x32b, src_temp2_8x16b);
                res_temp3_4x32b = _mm_unpacklo_epi16(res_temp3_4x32b, src_temp3_8x16b);

                /* i4_tmp = (pi2_src[col] + lvl_shift) * wgt0 + 1 << (shift - 1) */
                res_temp4_4x32b = _mm_add_epi32(res_temp4_4x32b, lvl_shift_4x32b);
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, lvl_shift_4x32b);
                res_temp6_4x32b = _mm_add_epi32(res_temp6_4x32b, lvl_shift_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, lvl_shift_4x32b);
                res_temp0_4x32b = _mm_add_epi32(res_temp0_4x32b, lvl_shift_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, lvl_shift_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, lvl_shift_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, lvl_shift_4x32b);

                /* (i4_tmp >> shift) */ /* First 4 pixels */
                res_temp0_4x32b = _mm_srai_epi32(res_temp0_4x32b, shift);
                res_temp1_4x32b = _mm_srai_epi32(res_temp1_4x32b, shift);
                res_temp2_4x32b = _mm_srai_epi32(res_temp2_4x32b, shift);
                res_temp3_4x32b = _mm_srai_epi32(res_temp3_4x32b, shift);

                /* (i4_tmp >> shift) */ /* Last 4 pixels */
                res_temp4_4x32b = _mm_srai_epi32(res_temp4_4x32b, shift);
                res_temp5_4x32b = _mm_srai_epi32(res_temp5_4x32b, shift);
                res_temp6_4x32b = _mm_srai_epi32(res_temp6_4x32b, shift);
                res_temp7_4x32b = _mm_srai_epi32(res_temp7_4x32b, shift);

                /*i4_tmp = (i4_tmp >> shift) + off0; */ /* First 4 pixels */
                res_temp0_4x32b = _mm_add_epi32(res_temp0_4x32b, off0_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, off0_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, off0_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, off0_4x32b);

                /*i4_tmp = (i4_tmp >> shift) + off0; */ /* Last 4 pixels */
                res_temp4_4x32b = _mm_add_epi32(res_temp4_4x32b, off0_4x32b);
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, off0_4x32b);
                res_temp6_4x32b = _mm_add_epi32(res_temp6_4x32b, off0_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, off0_4x32b);

                res_temp0_4x32b = _mm_packs_epi32(res_temp0_4x32b, res_temp4_4x32b);
                res_temp1_4x32b = _mm_packs_epi32(res_temp1_4x32b, res_temp5_4x32b);
                res_temp2_4x32b = _mm_packs_epi32(res_temp2_4x32b, res_temp6_4x32b);
                res_temp3_4x32b = _mm_packs_epi32(res_temp3_4x32b, res_temp7_4x32b);
                /* pu1_dst[col] = CLIP_U8(i4_tmp); */
                res_temp0_4x32b = _mm_packus_epi16(res_temp0_4x32b, res_temp0_4x32b);
                res_temp1_4x32b = _mm_packus_epi16(res_temp1_4x32b, res_temp1_4x32b);
                res_temp2_4x32b = _mm_packus_epi16(res_temp2_4x32b, res_temp2_4x32b);
                res_temp3_4x32b = _mm_packus_epi16(res_temp3_4x32b, res_temp3_4x32b);

                /* store four 8-bit output values  */
                _mm_storel_epi64((__m128i *)(pu1_dst + 0 * dst_strd), res_temp0_4x32b); /* row = 0*/
                _mm_storel_epi64((__m128i *)(pu1_dst + 1 * dst_strd), res_temp1_4x32b); /* row = 2*/
                _mm_storel_epi64((__m128i *)(pu1_dst + 2 * dst_strd), res_temp2_4x32b); /* row = 1*/
                _mm_storel_epi64((__m128i *)(pu1_dst + 3 * dst_strd), res_temp3_4x32b); /* row = 3*/

                /* To update pointer */
                pi2_src += 8;
                pu1_dst += 8;

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src = pi2_src - wd + 4 * src_strd;    /* Pointer update */
            pu1_dst = pu1_dst - wd + 4 * dst_strd; /* Pointer update */

        }
    }
    else  /* wd multiple of 4 case */
    {
        WORD32 dst0, dst1, dst2, dst3;
        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 4)
            {   /* for row =0 ,1,2,3*/

                /* row = 0 */ /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp0_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src));
                /* row = 1 */
                src_temp1_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + src_strd));
                /* row = 2 */
                src_temp2_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + 2 * src_strd));
                /* row = 3 */
                src_temp3_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + 3 * src_strd));

                /* 2 rows together */
                src_temp0_8x16b = _mm_unpacklo_epi64(src_temp0_8x16b, src_temp2_8x16b);
                src_temp1_8x16b = _mm_unpacklo_epi64(src_temp1_8x16b, src_temp3_8x16b);

                /*i4_tmp = (pi2_src[col]) * wgt0*/ /* Lower 16 bit */
                res_temp0_4x32b  = _mm_mullo_epi16(src_temp0_8x16b, wgt0_8x16b);
                res_temp1_4x32b  = _mm_mullo_epi16(src_temp1_8x16b, wgt0_8x16b);
                /*i4_tmp = (pi2_src[col]) * wgt0*/ /* Higher 16 bit */
                src_temp0_8x16b  = _mm_mulhi_epi16(src_temp0_8x16b, wgt0_8x16b);
                src_temp1_8x16b  = _mm_mulhi_epi16(src_temp1_8x16b, wgt0_8x16b);

                /* Get 32 bit Result */
                res_temp2_4x32b = _mm_unpackhi_epi16(res_temp0_4x32b, src_temp0_8x16b);
                res_temp3_4x32b = _mm_unpackhi_epi16(res_temp1_4x32b, src_temp1_8x16b);

                res_temp0_4x32b = _mm_unpacklo_epi16(res_temp0_4x32b, src_temp0_8x16b);
                res_temp1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, src_temp1_8x16b);

                /* i4_tmp = (pi2_src[col] + lvl_shift) * wgt0 + 1 << (shift - 1) */
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, lvl_shift_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, lvl_shift_4x32b);
                res_temp0_4x32b = _mm_add_epi32(res_temp0_4x32b, lvl_shift_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, lvl_shift_4x32b);

                /* (i4_tmp >> shift) */
                res_temp0_4x32b = _mm_srai_epi32(res_temp0_4x32b, shift);
                res_temp1_4x32b = _mm_srai_epi32(res_temp1_4x32b, shift);
                res_temp2_4x32b = _mm_srai_epi32(res_temp2_4x32b, shift);
                res_temp3_4x32b = _mm_srai_epi32(res_temp3_4x32b, shift);

                /*i4_tmp = (i4_tmp >> shift) + off0; */
                res_temp0_4x32b = _mm_add_epi32(res_temp0_4x32b, off0_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, off0_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, off0_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, off0_4x32b);

                res_temp0_4x32b = _mm_packs_epi32(res_temp0_4x32b, res_temp1_4x32b);
                res_temp2_4x32b = _mm_packs_epi32(res_temp2_4x32b, res_temp3_4x32b);

                /* pu1_dst[col] = CLIP_U8(i4_tmp); */
                res_temp0_4x32b = _mm_packus_epi16(res_temp0_4x32b, res_temp2_4x32b);

                dst0 = _mm_cvtsi128_si32(res_temp0_4x32b);
                /* dst row = 1 to 3 */
                res_temp1_4x32b = _mm_shuffle_epi32(res_temp0_4x32b, 1);
                res_temp2_4x32b = _mm_shuffle_epi32(res_temp0_4x32b, 2);
                res_temp3_4x32b = _mm_shuffle_epi32(res_temp0_4x32b, 3);

                /* store four 8-bit output values  */
                *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0;

                dst1 = _mm_cvtsi128_si32(res_temp1_4x32b);
                dst2 = _mm_cvtsi128_si32(res_temp2_4x32b);
                dst3 = _mm_cvtsi128_si32(res_temp3_4x32b);

                /* row = 1 to row = 3 */
                *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1;
                *(WORD32 *)(&pu1_dst[2 * dst_strd]) = dst2;
                *(WORD32 *)(&pu1_dst[3 * dst_strd]) = dst3;

                /* To update pointer */
                pi2_src += 4;
                pu1_dst += 4;

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src = pi2_src - wd + 4 * src_strd;    /* Pointer update */
            pu1_dst = pu1_dst - wd + 4 * dst_strd; /* Pointer update */

        }
    }
}